

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::RoundFun::GetFunctions(void)

{
  LogicalType LVar1;
  char cVar2;
  InternalException *this;
  ScalarFunctionSet *in_RDI;
  code *pcVar3;
  long lVar4;
  LogicalType *pLVar5;
  code *pcVar6;
  pointer pLVar7;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_3f9;
  ScalarFunctionSet *local_3f8;
  ScalarFunctionSet *local_3f0;
  LogicalType *local_3e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e0;
  scalar_function_t round_func;
  scalar_function_t round_prec_func;
  LogicalType local_380 [24];
  LogicalType local_368 [24];
  LogicalType local_350 [24];
  LogicalType local_338 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_320;
  LogicalType local_308 [24];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_2f0;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_2d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b0;
  LogicalType local_298 [24];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Numeric();
  local_3f0 = in_RDI + 0x20;
  local_3e8 = local_3e0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pLVar5 = local_3e0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar7 = local_3e0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_3f8 = in_RDI;
  do {
    if (pLVar7 == pLVar5) {
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e0);
      return local_3f8;
    }
    round_prec_func.super__Function_base._M_manager = (_Manager_type)0x0;
    round_prec_func._M_invoker = (_Invoker_type)0x0;
    round_prec_func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    round_prec_func.super__Function_base._M_functor._8_8_ = 0;
    round_func.super__Function_base._M_manager = (_Manager_type)0x0;
    round_func._M_invoker = (_Invoker_type)0x0;
    round_func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    round_func.super__Function_base._M_functor._8_8_ = 0;
    cVar2 = duckdb::LogicalType::IsIntegral();
    if (cVar2 == '\0') {
      LVar1 = *pLVar7;
      pcVar3 = BindDecimalRoundPrecision;
      pcVar6 = BindGenericRoundFunctionDecimal<duckdb::RoundDecimalOperator>;
      if (LVar1 != (LogicalType)0x15) {
        pcVar3 = ScalarFunction::UnaryFunction<float,float,duckdb::RoundOperator>;
        pcVar6 = ScalarFunction::BinaryFunction<float,int,float,duckdb::RoundOperatorPrecision>;
        if (LVar1 != (LogicalType)0x16) {
          if (LVar1 != (LogicalType)0x17) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)local_380,"Unimplemented numeric type for function \"floor\"",
                       (allocator *)&local_3f9);
            duckdb::InternalException::InternalException(this,(string *)local_380);
            __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
          }
          pcVar3 = ScalarFunction::UnaryFunction<double,double,duckdb::RoundOperator>;
          pcVar6 = ScalarFunction::BinaryFunction<double,int,double,duckdb::RoundOperatorPrecision>;
        }
        std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                  ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                   &round_func,pcVar3);
        std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                  ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                   &round_prec_func,pcVar6);
        pcVar3 = (code *)0x0;
        pcVar6 = (code *)0x0;
      }
      duckdb::LogicalType::LogicalType(local_380,pLVar7);
      __l._M_len = 1;
      __l._M_array = local_380;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_320,__l,&local_3f9);
      duckdb::LogicalType::LogicalType(local_338,pLVar7);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(&local_2d0,&round_func);
      duckdb::LogicalType::LogicalType(local_298,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_158,&local_320,local_338,&local_2d0,pcVar6,0,0,0,local_298,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 local_3f0,&local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      duckdb::LogicalType::~LogicalType(local_298);
      std::_Function_base::~_Function_base(&local_2d0.super__Function_base);
      duckdb::LogicalType::~LogicalType(local_338);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_320);
      duckdb::LogicalType::~LogicalType(local_380);
      duckdb::LogicalType::LogicalType(local_380,pLVar7);
      duckdb::LogicalType::LogicalType(local_368,INTEGER);
      __l_00._M_len = 2;
      __l_00._M_array = local_380;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2b0,__l_00,&local_3f9);
      duckdb::LogicalType::LogicalType(local_350,pLVar7);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(&local_2f0,&round_prec_func);
      duckdb::LogicalType::LogicalType(local_308,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_280,&local_2b0,local_350,&local_2f0,pcVar3,0,0,0,local_308,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 local_3f0,&local_280);
      ScalarFunction::~ScalarFunction(&local_280);
      duckdb::LogicalType::~LogicalType(local_308);
      std::_Function_base::~_Function_base(&local_2f0.super__Function_base);
      duckdb::LogicalType::~LogicalType(local_350);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b0);
      lVar4 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType(local_380 + lVar4);
        lVar4 = lVar4 + -0x18;
        pLVar5 = local_3e8;
      } while (lVar4 != -0x18);
    }
    std::_Function_base::~_Function_base(&round_func.super__Function_base);
    std::_Function_base::~_Function_base(&round_prec_func.super__Function_base);
    pLVar7 = pLVar7 + 0x18;
  } while( true );
}

Assistant:

ScalarFunctionSet RoundFun::GetFunctions() {
	ScalarFunctionSet round;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t round_prec_func = nullptr;
		scalar_function_t round_func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		bind_scalar_function_t bind_prec_func = nullptr;
		if (type.IsIntegral()) {
			// no round for integral numbers
			continue;
		}
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			round_func = ScalarFunction::UnaryFunction<float, float, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<float, int32_t, float, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DOUBLE:
			round_func = ScalarFunction::UnaryFunction<double, double, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<double, int32_t, double, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<RoundDecimalOperator>;
			bind_prec_func = BindDecimalRoundPrecision;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"floor\"");
		}
		round.AddFunction(ScalarFunction({type}, type, round_func, bind_func));
		round.AddFunction(ScalarFunction({type, LogicalType::INTEGER}, type, round_prec_func, bind_prec_func));
	}
	return round;
}